

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeventqueue.h
# Opt level: O0

xcb_generic_event_t * __thiscall
QXcbEventQueue::peek<QXcbConnection::compressEvent(xcb_generic_event_t*)const::__2>
          (QXcbEventQueue *this,PeekOption option,anon_class_16_2_e8808096 *peeker)

{
  bool bVar1;
  xcb_generic_event_t *in_RDX;
  int in_ESI;
  QXcbEventQueue *in_RDI;
  xcb_generic_event_t *event;
  QXcbEventNode *node;
  QXcbEventQueue *in_stack_ffffffffffffffd0;
  xcb_generic_event_t *pxVar2;
  long *plVar3;
  undefined4 in_stack_ffffffffffffffe8;
  
  flushBufferedEvents(in_stack_ffffffffffffffd0);
  bVar1 = isEmpty(in_RDI);
  if (!bVar1) {
    plVar3 = *(long **)(in_RDI + 0x10);
    while( true ) {
      pxVar2 = (xcb_generic_event_t *)*plVar3;
      if ((pxVar2 != (xcb_generic_event_t *)0x0) &&
         (bVar1 = QXcbConnection::compressEvent::anon_class_16_2_e8808096::operator()
                            ((anon_class_16_2_e8808096 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                             in_RDX,(int)((ulong)plVar3 >> 0x20)), bVar1)) {
        if ((in_ESI == 3) || (in_ESI == 4)) {
          *plVar3 = 0;
        }
        if (in_ESI != 4) {
          return pxVar2;
        }
      }
      if (plVar3 == *(long **)(in_RDI + 0x18)) break;
      plVar3 = (long *)plVar3[1];
    }
  }
  return (xcb_generic_event_t *)0x0;
}

Assistant:

xcb_generic_event_t *QXcbEventQueue::peek(PeekOption option, Peeker &&peeker)
{
    flushBufferedEvents();
    if (isEmpty())
        return nullptr;

    QXcbEventNode *node = m_head;
    do {
        xcb_generic_event_t *event = node->event;
        if (event && peeker(event, event->response_type & ~0x80)) {
            if (option == PeekConsumeMatch || option == PeekConsumeMatchAndContinue)
                node->event = nullptr;

            if (option != PeekConsumeMatchAndContinue)
                return event;
        }
        if (node == m_flushedTail)
            break;
        node = node->next;
    } while (true);

    return nullptr;
}